

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffercache.h
# Opt level: O3

int * __thiscall
pbrt::BufferCache<int>::LookupOrAdd(BufferCache<int> *this,vector<int,_std::allocator<int>_> *buf)

{
  mutex *__mutex;
  memory_resource *pmVar1;
  int iVar2;
  iterator iVar3;
  int *__dest;
  pointer piVar4;
  undefined8 uVar5;
  pointer piVar6;
  pointer __src;
  __hashtable *__h;
  long in_FS_OFFSET;
  __node_gen_type __node_gen;
  Buffer lookupBuffer;
  key_type local_38;
  undefined4 extraout_var;
  
  *(long *)(in_FS_OFFSET + -0x428) = *(long *)(in_FS_OFFSET + -0x428) + 1;
  __mutex = &this->mutex;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 == 0) {
    local_38.ptr = (buf->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
    local_38.size =
         (long)(buf->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_finish - (long)local_38.ptr >> 2;
    iVar3 = std::
            _Hashtable<pbrt::BufferCache<int>::Buffer,_pbrt::BufferCache<int>::Buffer,_std::allocator<pbrt::BufferCache<int>::Buffer>,_std::__detail::_Identity,_std::equal_to<pbrt::BufferCache<int>::Buffer>,_pbrt::BufferCache<int>::BufferHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::find(&(this->cache)._M_h,&local_38);
    if (iVar3.super__Node_iterator_base<pbrt::BufferCache<int>::Buffer,_true>._M_cur ==
        (__node_type *)0x0) {
      piVar4 = (buf->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_finish;
      __src = (buf->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_start;
      if ((long)piVar4 - (long)__src == 0) {
        __dest = (int *)0x0;
      }
      else {
        pmVar1 = (this->alloc).memoryResource;
        iVar2 = (*pmVar1->_vptr_memory_resource[2])(pmVar1,(long)piVar4 - (long)__src,4);
        __dest = (int *)CONCAT44(extraout_var,iVar2);
        __src = (buf->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
                ._M_start;
        piVar4 = (buf->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      piVar6 = piVar4;
      if ((long)piVar4 - (long)__src != 0) {
        memmove(__dest,__src,(long)piVar4 - (long)__src);
        piVar6 = (buf->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        piVar4 = (buf->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      this->bytesUsed = (long)piVar4 + (this->bytesUsed - (long)piVar6);
      std::
      _Hashtable<pbrt::BufferCache<int>::Buffer,pbrt::BufferCache<int>::Buffer,std::allocator<pbrt::BufferCache<int>::Buffer>,std::__detail::_Identity,std::equal_to<pbrt::BufferCache<int>::Buffer>,pbrt::BufferCache<int>::BufferHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<pbrt::BufferCache<int>::Buffer,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<pbrt::BufferCache<int>::Buffer,true>>>>
                ((_Hashtable<pbrt::BufferCache<int>::Buffer,pbrt::BufferCache<int>::Buffer,std::allocator<pbrt::BufferCache<int>::Buffer>,std::__detail::_Identity,std::equal_to<pbrt::BufferCache<int>::Buffer>,pbrt::BufferCache<int>::BufferHasher,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&this->cache);
    }
    else {
      *(long *)(in_FS_OFFSET + -0x430) = *(long *)(in_FS_OFFSET + -0x430) + 1;
      *(long *)(in_FS_OFFSET + -0x438) =
           (long)(buf->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_end_of_storage +
           (*(long *)(in_FS_OFFSET + -0x438) -
           (long)(buf->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start);
      __dest = *(int **)((long)iVar3.super__Node_iterator_base<pbrt::BufferCache<int>::Buffer,_true>
                               ._M_cur + 8);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return __dest;
  }
  uVar5 = std::__throw_system_error(iVar2);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar5);
}

Assistant:

const T *LookupOrAdd(const std::vector<T> &buf) {
        ++nBufferCacheLookups;
        std::lock_guard<std::mutex> lock(mutex);
        // Return pointer to data if _buf_ contents is already in the cache
        Buffer lookupBuffer(buf.data(), buf.size());
        if (auto iter = cache.find(lookupBuffer); iter != cache.end()) {
            DCHECK(std::memcmp(buf.data(), iter->ptr, buf.size() * sizeof(T)) == 0);
            ++nBufferCacheHits;
            redundantBufferBytes += buf.capacity() * sizeof(T);
            return iter->ptr;
        }

        // Add _buf_ contents to cache and return pointer to cached copy
        T *ptr = alloc.allocate_object<T>(buf.size());
        std::copy(buf.begin(), buf.end(), ptr);
        bytesUsed += buf.size() * sizeof(T);
        cache.insert(Buffer(ptr, buf.size()));
        return ptr;
    }